

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

Block * __thiscall
wasm::I64ToI32Lowering::makeLargeShrU
          (I64ToI32Lowering *this,Index highBits,Index leftHigh,Index shift)

{
  Builder *this_00;
  Builder *pBVar1;
  Const *value;
  LocalSet *any;
  Expression *pEVar2;
  Expression *pEVar3;
  Binary *this_01;
  Block *pBVar4;
  
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  value = Builder::makeConst<int>(this_00,0);
  any = Builder::makeLocalSet(this_00,highBits,(Expression *)value);
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  pEVar2 = (Expression *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
  pEVar2->_id = LocalGetId;
  *(Index *)(pEVar2 + 1) = leftHigh;
  (pEVar2->type).id = 2;
  pEVar3 = (Expression *)
           MixedArena::allocSpace
                     (&((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl)->wasm->
                       allocator,0x18,8);
  pEVar3->_id = LocalGetId;
  *(Index *)(pEVar3 + 1) = shift;
  (pEVar3->type).id = 2;
  this_01 = (Binary *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x28,8);
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_01->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_01->op = ShrUInt32;
  this_01->left = pEVar2;
  this_01->right = pEVar3;
  Binary::finalize(this_01);
  pBVar4 = Builder::blockify(this_00,(Expression *)any,(Expression *)this_01);
  return pBVar4;
}

Assistant:

Block* makeLargeShrU(Index highBits, Index leftHigh, Index shift) {
    return builder->blockify(
      builder->makeLocalSet(highBits, builder->makeConst(int32_t(0))),
      builder->makeBinary(ShrUInt32,
                          builder->makeLocalGet(leftHigh, Type::i32),
                          builder->makeLocalGet(shift, Type::i32)));
  }